

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O1

void __thiscall Spi::flash_reset(Spi *this)

{
  set_gpio(this,0,0);
  xfer_spi_bits(this,0xff,8);
  set_gpio(this,1,0);
  set_gpio(this,0,0);
  xfer_spi_bits(this,0xff,2);
  set_gpio(this,1,0);
  return;
}

Assistant:

void Spi::flash_reset() {
	flash_chip_select();
	xfer_spi_bits(0xFF, 8);
	flash_chip_deselect();

	flash_chip_select();
	xfer_spi_bits(0xFF, 2);
	flash_chip_deselect();
}